

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness_sim.c
# Opt level: O2

Vec_Ptr_t * populateLivenessVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  char *pcVar1;
  Aig_Obj_t *Entry;
  uint uVar2;
  int i;
  
  p = Vec_PtrAlloc(100);
  uVar2 = 0;
  for (i = 0; i < pNtk->vPos->nSize; i = i + 1) {
    pObj = Abc_NtkPo(pNtk,i);
    pcVar1 = Abc_ObjName(pObj);
    pcVar1 = strstr(pcVar1,"assert_fair");
    if (pcVar1 != (char *)0x0) {
      Entry = Aig_ManCo(pAig,i);
      Vec_PtrPush(p,Entry);
      uVar2 = uVar2 + 1;
    }
  }
  printf("\nNumber of liveness property found = %d\n",(ulong)uVar2);
  return p;
}

Assistant:

static Vec_Ptr_t * populateLivenessVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, liveCounter = 0;
    Vec_Ptr_t * vLive;

    vLive = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        if( strstr( Abc_ObjName( pNode ), "assert_fair") != NULL )
        {
            Vec_PtrPush( vLive, Aig_ManCo( pAig, i ) );
            liveCounter++;
        }
    printf("\nNumber of liveness property found = %d\n", liveCounter);
    return vLive;
}